

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UNumberFormatRoundingMode icu_63::number::impl::stem_to_object::roundingMode(StemEnum stem)

{
  UNumberFormatRoundingMode local_c;
  StemEnum stem_local;
  
  switch(stem) {
  case STEM_ROUNDING_MODE_CEILING:
    local_c = UNUM_ROUND_CEILING;
    break;
  case STEM_ROUNDING_MODE_FLOOR:
    local_c = UNUM_ROUND_FLOOR;
    break;
  case STEM_ROUNDING_MODE_DOWN:
    local_c = UNUM_ROUND_DOWN;
    break;
  case STEM_ROUNDING_MODE_UP:
    local_c = UNUM_ROUND_UP;
    break;
  case STEM_ROUNDING_MODE_HALF_EVEN:
    local_c = UNUM_FOUND_HALFEVEN;
    break;
  case STEM_ROUNDING_MODE_HALF_DOWN:
    local_c = UNUM_ROUND_HALFDOWN;
    break;
  case STEM_ROUNDING_MODE_HALF_UP:
    local_c = UNUM_ROUND_HALFUP;
    break;
  case STEM_ROUNDING_MODE_UNNECESSARY:
    local_c = UNUM_ROUND_UNNECESSARY;
    break;
  default:
    local_c = UNUM_ROUND_UNNECESSARY;
  }
  return local_c;
}

Assistant:

UNumberFormatRoundingMode stem_to_object::roundingMode(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_ROUNDING_MODE_CEILING:
            return UNUM_ROUND_CEILING;
        case STEM_ROUNDING_MODE_FLOOR:
            return UNUM_ROUND_FLOOR;
        case STEM_ROUNDING_MODE_DOWN:
            return UNUM_ROUND_DOWN;
        case STEM_ROUNDING_MODE_UP:
            return UNUM_ROUND_UP;
        case STEM_ROUNDING_MODE_HALF_EVEN:
            return UNUM_ROUND_HALFEVEN;
        case STEM_ROUNDING_MODE_HALF_DOWN:
            return UNUM_ROUND_HALFDOWN;
        case STEM_ROUNDING_MODE_HALF_UP:
            return UNUM_ROUND_HALFUP;
        case STEM_ROUNDING_MODE_UNNECESSARY:
            return UNUM_ROUND_UNNECESSARY;
        default:
            U_ASSERT(false);
            return UNUM_ROUND_UNNECESSARY;
    }
}